

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcSymLocalBase::check_local_references(CTcSymLocalBase *this)

{
  CTcMain *this_00;
  int iVar1;
  CTcTokFileDesc *linedesc;
  long linenum;
  size_t sVar2;
  char *pcVar3;
  CTcSymLocalBase *in_RDI;
  bool bVar4;
  int param;
  tc_severity_t sev;
  int err;
  uint local_10;
  uint local_c;
  
  local_10 = 2;
  if (in_RDI->ctx_orig_ == (CTcSymLocal *)0x0) {
    iVar1 = is_param(in_RDI);
    bVar4 = true;
    if (iVar1 == 0) {
      iVar1 = is_list_param(in_RDI);
      bVar4 = true;
      if (iVar1 == 0) {
        iVar1 = is_opt_param(in_RDI);
        bVar4 = true;
        if (iVar1 == 0) {
          iVar1 = is_named_param(in_RDI);
          bVar4 = iVar1 != 0;
        }
      }
    }
    iVar1 = get_val_used(in_RDI);
    if (((iVar1 != 0) || (iVar1 = get_val_assigned(in_RDI), iVar1 != 0)) || (bVar4)) {
      iVar1 = get_val_used(in_RDI);
      if (iVar1 == 0) {
        if (bVar4) {
          local_10 = 1;
          local_c = 0x2d15;
        }
        else {
          local_c = 0x2d0f;
        }
      }
      else {
        iVar1 = get_val_assigned(in_RDI);
        if (iVar1 != 0) {
          return;
        }
        if (bVar4) {
          return;
        }
        local_c = 0x2d0e;
      }
    }
    else {
      local_c = 0x2d0d;
    }
    this_00 = G_tcmain;
    linedesc = get_src_desc(in_RDI);
    linenum = get_src_linenum(in_RDI);
    sVar2 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x25c4be);
    pcVar3 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x25c4cc);
    CTcMain::log_error(this_00,linedesc,linenum,(tc_severity_t)(ulong)local_10,(int)(ulong)local_c,
                       sVar2 & 0xffffffff,pcVar3);
  }
  return;
}

Assistant:

void CTcSymLocalBase::check_local_references()
{
    int err;
    tc_severity_t sev = TC_SEV_WARNING;
    
    /* 
     *   if this isn't an original, but is simply a copy of a variable
     *   inherited from an enclosing scope (such as into an anonymous
     *   function), don't bother even checking for errors - we'll let the
     *   original symbol take care of reporting its own errors 
     */
    if (ctx_orig_ != 0)
        return;

    /* 
     *   Note if this is some kind of parameter.  Some parameters are
     *   represented as locals: varargs-list parameters, optional parameters,
     *   and named parameters.  We need to check for those kinds of
     *   parameters specifically because they otherwise look like regular
     *   local variables.  
     */
    int param = (is_param() || is_list_param()
                 || is_opt_param() || is_named_param());

    /* 
     *   If it's unreferenced or unassigned (or both), log an error; note
     *   that a formal parameter is always assigned, since the value is
     *   assigned by the caller.  
     */
    if (!get_val_used() && !get_val_assigned() && !param)
    {
        /* this is a regular local that was never assigned or referenced */
        err = TCERR_UNREFERENCED_LOCAL;
    }
    else if (!get_val_used())
    {
        if (param)
        {
            /* it's a parameter - generate only a pendantic error */
            sev = TC_SEV_PEDANTIC;
            err = TCERR_UNREFERENCED_PARAM;
        }
        else
        {
            /* 
             *   this is a regular local with a value that was assigned and
             *   never used 
             */
            err = TCERR_UNUSED_LOCAL_ASSIGNMENT;
        }
    }
    else if (!get_val_assigned() && !param)
    {
        /* it's used but never assigned */
        err = TCERR_UNASSIGNED_LOCAL;
    }
    else
    {
        /* no error */
        return;
    }

    /* 
     *   display the warning message, showing the error location as the
     *   source line where the local was defined 
     */
    G_tcmain->log_error(get_src_desc(), get_src_linenum(),
                        sev, err, (int)get_sym_len(), get_sym());
}